

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

DWORD __thiscall FNodeBuilder::SplitSeg(FNodeBuilder *this,DWORD segnum,int splitvert,int v1InFront)

{
  uint *puVar1;
  undefined8 *puVar2;
  DWORD DVar3;
  DWORD DVar4;
  uint uVar5;
  FPrivVert *pFVar6;
  FPrivSeg *pFVar7;
  undefined8 uVar8;
  sector_t *psVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  FPrivSeg *pFVar14;
  FPrivSeg *pFVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  DWORD DVar19;
  DWORD *pDVar20;
  DWORD DVar21;
  int vertnum;
  int vertnum_00;
  DWORD local_90;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_4c;
  undefined4 uStack_48;
  
  DVar3 = (this->Segs).Count;
  pFVar7 = (this->Segs).Array + segnum;
  vertnum_00 = pFVar7->v1;
  vertnum = pFVar7->v2;
  uVar8 = *(undefined8 *)((long)&pFVar7->backsector + 4);
  uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar7->frontsector + 4) >> 0x20);
  iVar16 = pFVar7->sidedef;
  iVar17 = pFVar7->linedef;
  psVar9 = pFVar7->frontsector;
  local_4c = (undefined4)((ulong)psVar9 >> 0x20);
  iVar18 = pFVar7->loopnum;
  DVar19 = pFVar7->partner;
  uVar10 = pFVar7->storedseg;
  uVar11 = pFVar7->planenum;
  uVar12 = pFVar7->planefront;
  uVar13 = *(undefined3 *)&pFVar7->field_0x3d;
  pFVar14 = pFVar7->hashnext;
  if (v1InFront < 1) {
    pFVar7->v1 = splitvert;
    RemoveSegFromVert1(this,segnum,vertnum_00);
    pFVar6 = (this->Vertices).Array;
    local_90 = pFVar6[vertnum_00].segs;
    pFVar6[vertnum_00].segs = DVar3;
    pDVar20 = &pFVar6[splitvert].segs;
    DVar4 = *pDVar20;
    DVar21 = pFVar6[splitvert].segs2;
    pFVar6[splitvert].segs2 = DVar3;
    (this->Segs).Array[segnum].nextforvert = DVar4;
    vertnum = splitvert;
  }
  else {
    pFVar7->v2 = splitvert;
    RemoveSegFromVert2(this,segnum,vertnum);
    pFVar6 = (this->Vertices).Array;
    pDVar20 = &pFVar6[splitvert].segs2;
    local_90 = pFVar6[splitvert].segs;
    pFVar6[splitvert].segs = DVar3;
    DVar21 = pFVar6[vertnum].segs2;
    pFVar6[vertnum].segs2 = DVar3;
    (this->Segs).Array[segnum].nextforvert2 = *pDVar20;
    vertnum_00 = splitvert;
  }
  *pDVar20 = segnum;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
  pFVar7 = (this->Segs).Array;
  uVar5 = (this->Segs).Count;
  pFVar7[uVar5].v1 = vertnum_00;
  pFVar7[uVar5].v2 = vertnum;
  pFVar15 = pFVar7 + uVar5;
  pFVar15->sidedef = iVar16;
  pFVar15->linedef = iVar17;
  *(sector_t **)(&pFVar15->sidedef + 2) = psVar9;
  puVar2 = (undefined8 *)((long)&pFVar7[uVar5].frontsector + 4);
  *puVar2 = CONCAT44(uStack_48,local_4c);
  puVar2[1] = uVar8;
  pFVar7[uVar5].nextforvert = local_90;
  pFVar7[uVar5].nextforvert2 = DVar21;
  uVar8 = CONCAT44(uVar11,uVar10);
  pFVar15 = pFVar7 + uVar5;
  pFVar15->loopnum = iVar18;
  pFVar15->partner = DVar19;
  *(undefined8 *)(&pFVar15->loopnum + 2) = uVar8;
  pFVar7 = pFVar7 + uVar5;
  pFVar7->planenum = uVar11;
  pFVar7->planefront = (bool)uVar12;
  *(undefined3 *)&pFVar7->field_0x3d = uVar13;
  *(FPrivSeg **)(&pFVar7->planenum + 2) = pFVar14;
  puVar1 = &(this->Segs).Count;
  *puVar1 = *puVar1 + 1;
  return DVar3;
}

Assistant:

DWORD FNodeBuilder::SplitSeg (DWORD segnum, int splitvert, int v1InFront)
{
	double dx, dy;
	FPrivSeg newseg;
	int newnum = (int)Segs.Size();

	newseg = Segs[segnum];
	dx = double(Vertices[splitvert].x - Vertices[newseg.v1].x);
	dy = double(Vertices[splitvert].y - Vertices[newseg.v1].y);
	if (v1InFront > 0)
	{
		newseg.v1 = splitvert;
		Segs[segnum].v2 = splitvert;

		RemoveSegFromVert2 (segnum, newseg.v2);

		newseg.nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = newnum;

		newseg.nextforvert2 = Vertices[newseg.v2].segs2;
		Vertices[newseg.v2].segs2 = newnum;

		Segs[segnum].nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = segnum;
	}
	else
	{
		Segs[segnum].v1 = splitvert;
		newseg.v2 = splitvert;

		RemoveSegFromVert1 (segnum, newseg.v1);

		newseg.nextforvert = Vertices[newseg.v1].segs;
		Vertices[newseg.v1].segs = newnum;

		newseg.nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = newnum;

		Segs[segnum].nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = segnum;
	}

	Segs.Push (newseg);

	D(Printf (PRINT_LOG, "Split seg %d to get seg %d\n", segnum, newnum));

	return newnum;
}